

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

void ma_context_get_device_info_sink_callback__pulse
               (ma_pa_context *pPulseContext,ma_pa_sink_info *pInfo,int endOfList,void *pUserData)

{
  ma_uint32 mVar1;
  long lVar2;
  uint uVar3;
  ma_format mVar4;
  
  if (endOfList < 1) {
    if (pUserData == (void *)0x0) {
      __assert_fail("pData != __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                    ,0x4b0c,
                    "void ma_context_get_device_info_sink_callback__pulse(ma_pa_context *, const ma_pa_sink_info *, int, void *)"
                   );
    }
    *(undefined4 *)((long)pUserData + 8) = 1;
    if (pInfo->name != (char *)0x0) {
      ma_strncpy_s(*pUserData,0x100,pInfo->name,0xffffffffffffffff);
    }
    if (pInfo->description != (char *)0x0) {
      ma_strncpy_s((char *)(*pUserData + 0x100),0x100,pInfo->description,0xffffffffffffffff);
    }
    lVar2 = *pUserData;
    uVar3 = (uint)(pInfo->sample_spec).channels;
    *(uint *)(lVar2 + 0x21c) = uVar3;
    *(uint *)(lVar2 + 0x220) = uVar3;
    mVar1 = (pInfo->sample_spec).rate;
    *(ma_uint32 *)(lVar2 + 0x224) = mVar1;
    *(ma_uint32 *)(lVar2 + 0x228) = mVar1;
    *(undefined4 *)(lVar2 + 0x200) = 1;
    mVar4 = ma_format_from_pulse((pInfo->sample_spec).format);
    *(ma_format *)(lVar2 + 0x204) = mVar4;
  }
  return;
}

Assistant:

static void ma_context_get_device_info_sink_callback__pulse(ma_pa_context* pPulseContext, const ma_pa_sink_info* pInfo, int endOfList, void* pUserData)
{
    ma_context_get_device_info_callback_data__pulse* pData = (ma_context_get_device_info_callback_data__pulse*)pUserData;

    if (endOfList > 0) {
        return;
    }

    MA_ASSERT(pData != NULL);
    pData->foundDevice = MA_TRUE;

    if (pInfo->name != NULL) {
        ma_strncpy_s(pData->pDeviceInfo->id.pulse, sizeof(pData->pDeviceInfo->id.pulse), pInfo->name, (size_t)-1);
    }

    if (pInfo->description != NULL) {
        ma_strncpy_s(pData->pDeviceInfo->name, sizeof(pData->pDeviceInfo->name), pInfo->description, (size_t)-1);
    }

    pData->pDeviceInfo->minChannels   = pInfo->sample_spec.channels;
    pData->pDeviceInfo->maxChannels   = pInfo->sample_spec.channels;
    pData->pDeviceInfo->minSampleRate = pInfo->sample_spec.rate;
    pData->pDeviceInfo->maxSampleRate = pInfo->sample_spec.rate;
    pData->pDeviceInfo->formatCount = 1;
    pData->pDeviceInfo->formats[0] = ma_format_from_pulse(pInfo->sample_spec.format);

    (void)pPulseContext; /* Unused. */
}